

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

bool __thiscall llvm::DWARFVerifier::handleAccelTables(DWARFVerifier *this)

{
  StringRef Data;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  StringRef *pSVar4;
  DWARFSection *pDVar5;
  size_t extraout_RDX;
  uint local_44;
  uint NumErrors;
  undefined1 local_30 [8];
  DataExtractor StrData;
  DWARFObject *D;
  DWARFVerifier *this_local;
  
  StrData._16_8_ = DWARFContext::getDWARFObj(this->DCtx);
  iVar2 = (*((DWARFObject *)StrData._16_8_)->_vptr_DWARFObject[0x11])();
  Data.Data._4_4_ = extraout_var;
  Data.Data._0_4_ = iVar2;
  bVar1 = DWARFContext::isLittleEndian(this->DCtx);
  Data.Length = extraout_RDX;
  DataExtractor::DataExtractor((DataExtractor *)local_30,Data,bVar1,'\0');
  local_44 = 0;
  pSVar4 = (StringRef *)(**(code **)(*(long *)StrData._16_8_ + 0x120))();
  bVar1 = StringRef::empty(pSVar4);
  if (!bVar1) {
    pDVar5 = (DWARFSection *)(**(code **)(*(long *)StrData._16_8_ + 0x120))();
    local_44 = verifyAppleAccelTable(this,pDVar5,(DataExtractor *)local_30,".apple_names");
  }
  pSVar4 = (StringRef *)(**(code **)(*(long *)StrData._16_8_ + 0x128))();
  bVar1 = StringRef::empty(pSVar4);
  if (!bVar1) {
    pDVar5 = (DWARFSection *)(**(code **)(*(long *)StrData._16_8_ + 0x128))();
    uVar3 = verifyAppleAccelTable(this,pDVar5,(DataExtractor *)local_30,".apple_types");
    local_44 = uVar3 + local_44;
  }
  pSVar4 = (StringRef *)(**(code **)(*(long *)StrData._16_8_ + 0x130))();
  bVar1 = StringRef::empty(pSVar4);
  if (!bVar1) {
    pDVar5 = (DWARFSection *)(**(code **)(*(long *)StrData._16_8_ + 0x130))();
    uVar3 = verifyAppleAccelTable(this,pDVar5,(DataExtractor *)local_30,".apple_namespaces");
    local_44 = uVar3 + local_44;
  }
  pSVar4 = (StringRef *)(**(code **)(*(long *)StrData._16_8_ + 0x140))();
  bVar1 = StringRef::empty(pSVar4);
  if (!bVar1) {
    pDVar5 = (DWARFSection *)(**(code **)(*(long *)StrData._16_8_ + 0x140))();
    uVar3 = verifyAppleAccelTable(this,pDVar5,(DataExtractor *)local_30,".apple_objc");
    local_44 = uVar3 + local_44;
  }
  pSVar4 = (StringRef *)(**(code **)(*(long *)StrData._16_8_ + 0x138))();
  bVar1 = StringRef::empty(pSVar4);
  if (!bVar1) {
    pDVar5 = (DWARFSection *)(**(code **)(*(long *)StrData._16_8_ + 0x138))();
    uVar3 = verifyDebugNames(this,pDVar5,(DataExtractor *)local_30);
    local_44 = uVar3 + local_44;
  }
  return local_44 == 0;
}

Assistant:

bool DWARFVerifier::handleAccelTables() {
  const DWARFObject &D = DCtx.getDWARFObj();
  DataExtractor StrData(D.getStrSection(), DCtx.isLittleEndian(), 0);
  unsigned NumErrors = 0;
  if (!D.getAppleNamesSection().Data.empty())
    NumErrors += verifyAppleAccelTable(&D.getAppleNamesSection(), &StrData,
                                       ".apple_names");
  if (!D.getAppleTypesSection().Data.empty())
    NumErrors += verifyAppleAccelTable(&D.getAppleTypesSection(), &StrData,
                                       ".apple_types");
  if (!D.getAppleNamespacesSection().Data.empty())
    NumErrors += verifyAppleAccelTable(&D.getAppleNamespacesSection(), &StrData,
                                       ".apple_namespaces");
  if (!D.getAppleObjCSection().Data.empty())
    NumErrors += verifyAppleAccelTable(&D.getAppleObjCSection(), &StrData,
                                       ".apple_objc");

  if (!D.getNamesSection().Data.empty())
    NumErrors += verifyDebugNames(D.getNamesSection(), StrData);
  return NumErrors == 0;
}